

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::expression_typechecker_t::visit
          (expression_typechecker_t *this,par_expression_t *expr)

{
  element_type *peVar1;
  expression_type_t expr_type;
  shared_ptr<tchecker::typed_expression_t> typed_sub_expr;
  undefined1 local_cc [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (expr->_expr).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_expression_t[3])(peVar1,this);
  acquire_typed_expression((expression_typechecker_t *)(local_cc + 4));
  local_cc._0_4_ = type_par(*(expression_type_t *)(local_cc._4_8_ + 8));
  std::
  make_shared<tchecker::typed_par_expression_t,tchecker::expression_type_t&,std::shared_ptr<tchecker::typed_expression_t>const&>
            ((expression_type_t *)&local_b8,(shared_ptr<tchecker::typed_expression_t> *)local_cc);
  std::__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_typed_expr,
             (__shared_ptr<tchecker::typed_par_expression_t,_(__gnu_cxx::_Lock_policy)2> *)&local_b8
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
  if ((local_cc._0_4_ == EXPR_TYPE_BAD) && (*(int *)(local_cc._4_8_ + 8) != 0)) {
    expression_t::to_string_abi_cxx11_
              (&local_78,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
    std::operator+(&local_58,"in expression ",&local_78);
    std::operator+(&local_38,&local_58,", invalid parentheses around ");
    expression_t::to_string_abi_cxx11_
              (&local_98,
               (expr->_expr).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::operator+(&local_b8,&local_38,&local_98);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->_error,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  return;
}

Assistant:

virtual void visit(tchecker::par_expression_t const & expr)
  {
    // Sub expression
    expr.expr().visit(*this);
    std::shared_ptr<tchecker::typed_expression_t> const typed_sub_expr{acquire_typed_expression()};

    // Typed expression
    enum tchecker::expression_type_t expr_type = type_par(typed_sub_expr->type());

    _typed_expr = std::make_shared<tchecker::typed_par_expression_t>(expr_type, typed_sub_expr);

    // Report bad type
    if (expr_type != tchecker::EXPR_TYPE_BAD)
      return;

    if (typed_sub_expr->type() != tchecker::EXPR_TYPE_BAD)
      _error("in expression " + expr.to_string() + ", invalid parentheses around " + expr.expr().to_string());
  }